

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Low_options>::insert_simplex_and_subfaces<std::initializer_list<unsigned_char>>
          (Simplex_tree<Low_options> *this,initializer_list<unsigned_char> *Nsimplex,
          Filtration_value *filtration)

{
  int iVar1;
  Filtration_value FVar2;
  Filtration_value FVar3;
  long lVar4;
  long lVar5;
  Filtration_value *filt;
  long lVar6;
  int iVar7;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var8;
  undefined8 *puVar9;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var10;
  long *in_FS_OFFSET;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar11;
  
  FVar2 = filtration[1];
  if (FVar2 == 0.0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    FVar3 = *filtration;
    if ((char)in_FS_OFFSET[-0x1d] == '\0') {
      insert_simplex_and_subfaces<std::initializer_list<unsigned_char>>();
    }
    if (in_FS_OFFSET[-0x1f] != in_FS_OFFSET[-0x20]) {
      in_FS_OFFSET[-0x1f] = in_FS_OFFSET[-0x20];
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)(*in_FS_OFFSET + -0x100),
               in_FS_OFFSET[-0x1f],FVar3,(long)FVar2 + (long)FVar3);
    lVar4 = in_FS_OFFSET[-0x20];
    lVar5 = in_FS_OFFSET[-0x1f];
    if (lVar4 != lVar5) {
      lVar6 = 0x3f;
      if (lVar5 - lVar4 != 0) {
        for (; (ulong)(lVar5 - lVar4) >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar4,lVar5,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar4,lVar5);
    }
    _Var8 = std::
            __unique<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (in_FS_OFFSET[-0x20],in_FS_OFFSET[-0x1f]);
    if ((_Var8._M_current != (uchar *)in_FS_OFFSET[-0x1f]) &&
       ((uchar *)in_FS_OFFSET[-0x1f] !=
        _Var8._M_current + (in_FS_OFFSET[-0x1f] - in_FS_OFFSET[-0x1f]))) {
      in_FS_OFFSET[-0x1f] = (long)(_Var8._M_current + (in_FS_OFFSET[-0x1f] - in_FS_OFFSET[-0x1f]));
    }
    _Var8._M_current = (uchar *)in_FS_OFFSET[-0x20];
    filt = (Filtration_value *)in_FS_OFFSET[-0x1f];
    if ((Filtration_value *)_Var8._M_current != filt) {
      _Var10._M_current = _Var8._M_current;
      do {
        if (*_Var10._M_current == (uchar)Nsimplex[3]._M_len) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = "cannot use the dummy null_vertex() as a real vertex";
          __cxa_throw(puVar9,&char_const*::typeinfo,0);
        }
        _Var10._M_current = _Var10._M_current + 1;
      } while ((Filtration_value *)_Var10._M_current != filt);
    }
    iVar7 = ~(uint)_Var8._M_current + (int)filt;
    iVar1 = (int)Nsimplex[8]._M_len;
    if (iVar7 < iVar1) {
      iVar7 = iVar1;
    }
    *(int *)&Nsimplex[8]._M_len = iVar7;
    pVar11 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       (this,(Siblings *)Nsimplex,
                        (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )(Nsimplex + 4),_Var8,filt);
    filtration = pVar11._8_8_;
  }
  pVar11._8_8_ = filtration;
  pVar11.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar11;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }